

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O2

int32_t __thiscall
icu_63::number::impl::MutablePatternModifier::apply
          (MutablePatternModifier *this,NumberStringBuilder *output,int32_t leftIndex,
          int32_t rightIndex,UErrorCode *status)

{
  int32_t prefixLen;
  int32_t suffixLen;
  int iVar1;
  ssize_t sVar2;
  uint position;
  int iVar3;
  UnicodeString local_70;
  
  prefixLen = insertPrefix(this,output,leftIndex,status);
  position = rightIndex + prefixLen;
  suffixLen = insertSuffix(this,output,position,status);
  iVar1 = (*this->fPatternInfo->_vptr_AffixPatternProvider[10])();
  iVar3 = 0;
  if ((char)iVar1 == '\0') {
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    sVar2 = NumberStringBuilder::splice
                      (output,leftIndex + prefixLen,(__off64_t *)(ulong)position,(int)&local_70,
                       (__off64_t *)0x0,0,0xb);
    iVar3 = (int)sVar2;
    UnicodeString::~UnicodeString(&local_70);
  }
  CurrencySpacingEnabledModifier::applyCurrencySpacing
            (output,leftIndex,prefixLen,position + iVar3,suffixLen,this->fSymbols,status);
  return suffixLen + prefixLen + iVar3;
}

Assistant:

int32_t MutablePatternModifier::apply(NumberStringBuilder& output, int32_t leftIndex, int32_t rightIndex,
                                      UErrorCode& status) const {
    // The unsafe code path performs self-mutation, so we need a const_cast.
    // This method needs to be const because it overrides a const method in the parent class.
    auto nonConstThis = const_cast<MutablePatternModifier*>(this);
    int32_t prefixLen = nonConstThis->insertPrefix(output, leftIndex, status);
    int32_t suffixLen = nonConstThis->insertSuffix(output, rightIndex + prefixLen, status);
    // If the pattern had no decimal stem body (like #,##0.00), overwrite the value.
    int32_t overwriteLen = 0;
    if (!fPatternInfo->hasBody()) {
        overwriteLen = output.splice(
                leftIndex + prefixLen,
                rightIndex + prefixLen,
                UnicodeString(),
                0,
                0,
                UNUM_FIELD_COUNT,
                status);
    }
    CurrencySpacingEnabledModifier::applyCurrencySpacing(
            output,
            leftIndex,
            prefixLen,
            rightIndex + overwriteLen + prefixLen,
            suffixLen,
            *fSymbols,
            status);
    return prefixLen + overwriteLen + suffixLen;
}